

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodExceptionTextTest.cpp
# Opt level: O0

void __thiscall MethodExceptionTextTest::MethodExceptionTextTest(MethodExceptionTextTest *this)

{
  shared_ptr<oout::EqualMatch> local_98;
  shared_ptr<WithExceptionInMethod> local_88;
  shared_ptr<WithExceptionInMethod> local_78;
  shared_ptr<oout::EqualMatch> local_68;
  shared_ptr<const_oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  MethodExceptionTextTest *local_10;
  MethodExceptionTextTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Exception in method represent as a text",&local_31);
  local_78.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)WithExceptionInMethod::failure;
  local_78.super___shared_ptr<WithExceptionInMethod,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<WithExceptionInMethod>();
  std::
  make_shared<oout::MethodExceptionText,void(WithExceptionInMethod::*)(std::__cxx11::string_const&)const,std::shared_ptr<WithExceptionInMethod>,char_const(&)[8]>
            ((offset_in_WithExceptionInMethod_to_subr *)&local_68,&local_78,(char (*) [8])&local_88)
  ;
  std::make_shared<oout::EqualMatch,char_const(&)[8]>((char (*) [8])&local_98);
  std::
  make_shared<oout::NamedTest_const,char_const(&)[46],std::shared_ptr<oout::MethodExceptionText>,std::shared_ptr<oout::EqualMatch>>
            ((char (*) [46])local_58,
             (shared_ptr<oout::MethodExceptionText> *)
             "MethodExceptionText catch exception as a text",&local_68);
  oout::dirty::Test::Test<std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_30,local_58);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualMatch>::~shared_ptr(&local_98);
  std::shared_ptr<oout::MethodExceptionText>::~shared_ptr
            ((shared_ptr<oout::MethodExceptionText> *)&local_68);
  std::shared_ptr<WithExceptionInMethod>::~shared_ptr(&local_88);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__MethodExceptionTextTest_003241e0;
  return;
}

Assistant:

MethodExceptionTextTest::MethodExceptionTextTest()
: dirty::Test(
	"Exception in method represent as a text",
	make_shared<const NamedTest>(
		"MethodExceptionText catch exception as a text",
		make_shared<MethodExceptionText>(
			&WithExceptionInMethod::failure,
			make_shared<WithExceptionInMethod>(),
			"no fate"
		),
		make_shared<EqualMatch>("no fate")
	)
)
{
}